

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FxchMan.c
# Opt level: O2

void Fxch_ManFree(Fxch_Man_t *pFxchMan)

{
  Hsh_VecMan_t *__ptr;
  Vec_Flt_t *__ptr_00;
  Vec_Que_t *__ptr_01;
  
  Vec_WecFree(pFxchMan->vLits);
  Vec_IntFree(pFxchMan->vLitCount);
  Vec_IntFree(pFxchMan->vLitHashKeys);
  __ptr = pFxchMan->pDivHash;
  Vec_IntFree(__ptr->vTable);
  Vec_IntFree(__ptr->vData);
  Vec_IntFree(__ptr->vMap);
  free(__ptr);
  __ptr_00 = pFxchMan->vDivWeights;
  free(__ptr_00->pArray);
  free(__ptr_00);
  __ptr_01 = pFxchMan->vDivPrio;
  if (__ptr_01->pOrder != (int *)0x0) {
    free(__ptr_01->pOrder);
    __ptr_01->pOrder = (int *)0x0;
  }
  free(__ptr_01->pHeap);
  free(__ptr_01);
  Vec_WecFree(pFxchMan->vDivCubePairs);
  Vec_IntFree(pFxchMan->vLevels);
  Vec_IntFree(pFxchMan->vCubeFree);
  Vec_IntFree(pFxchMan->vDiv);
  Vec_IntFree(pFxchMan->vCubesS);
  Vec_IntFree(pFxchMan->vPairs);
  Vec_IntFree(pFxchMan->vCubesToUpdate);
  Vec_IntFree(pFxchMan->vCubesToRemove);
  Vec_IntFree(pFxchMan->vSCC);
  free(pFxchMan);
  return;
}

Assistant:

void Fxch_ManFree( Fxch_Man_t* pFxchMan )
{
    Vec_WecFree( pFxchMan->vLits );
    Vec_IntFree( pFxchMan->vLitCount );
    Vec_IntFree( pFxchMan->vLitHashKeys );
    Hsh_VecManStop( pFxchMan->pDivHash );
    Vec_FltFree( pFxchMan->vDivWeights );
    Vec_QueFree( pFxchMan->vDivPrio );
    Vec_WecFree( pFxchMan->vDivCubePairs );
    Vec_IntFree( pFxchMan->vLevels );

    Vec_IntFree( pFxchMan->vCubeFree );
    Vec_IntFree( pFxchMan->vDiv );

    Vec_IntFree( pFxchMan->vCubesS );
    Vec_IntFree( pFxchMan->vPairs );
    Vec_IntFree( pFxchMan->vCubesToUpdate );
    Vec_IntFree( pFxchMan->vCubesToRemove );
    Vec_IntFree( pFxchMan->vSCC );

    ABC_FREE( pFxchMan );
}